

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

QDateTimeEditPrivate * __thiscall
QDateTimeEditPrivate::getMaximum(QDateTimeEditPrivate *this,QTimeZone *zone)

{
  long in_FS_OFFSET;
  QDate local_40;
  QTimeZone local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)zone[0x7a].d & 0x40) == 0) {
    if ((*(int *)&zone[0xa1].d - 1U & 3) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QDateTimeParser::getMaximum((QTimeZone *)this);
        return this;
      }
      goto LAB_003c367e;
    }
    QDate::QDate(&local_40,9999,0xc,0x1f);
    QDate::endOfDay(&local_38);
    QDateTime::toTimeZone((QTimeZone *)this);
  }
  else {
    ::QVariant::toDateTime();
    QDateTime::toTimeZone((QTimeZone *)this);
  }
  QDateTime::~QDateTime((QDateTime *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
LAB_003c367e:
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::getMaximum(const QTimeZone &zone) const
{
    if (keyboardTracking)
        return maximum.toDateTime().toTimeZone(zone);

    // QDTP's max is the local-time end of QDATETIMEEDIT_DATE_MAX, cached
    // (along with its conversion to UTC).
    if (timeZone.timeSpec() == Qt::LocalTime)
        return QDateTimeParser::getMaximum(zone);

    return QDATETIMEEDIT_DATE_MAX.endOfDay(timeZone).toTimeZone(zone);
}